

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  bool bVar8;
  
  if (ptr == end) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pbVar6 = (byte *)(ptr + uVar7);
  if (uVar7 == 0) {
    pbVar6 = (byte *)end;
  }
  bVar8 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar8) {
    pbVar6 = (byte *)end;
  }
  if (bVar8 && uVar7 == 0) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 - 0xd8 < 4) {
switchD_004875e4_caseD_7:
    if ((long)pbVar6 - (long)ptr < 4) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 4);
    goto LAB_00487637;
  }
  iVar3 = 0;
  pbVar5 = (byte *)ptr;
  if (bVar2 - 0xdc < 4) goto switchD_004876e5_caseD_0;
  if (bVar2 != 0) {
    if ((bVar2 == 0xff) && (0xfd < (byte)*ptr)) goto switchD_004876e5_caseD_0;
    goto switchD_004875e4_caseD_2;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_004876e5_caseD_0;
  default:
    goto switchD_004875e4_caseD_2;
  case 4:
    pbVar5 = (byte *)(ptr + 2);
    if (pbVar5 == pbVar6) {
      return -1;
    }
    if ((ptr[3] == '\0') && (*pbVar5 == 0x5d)) {
      if ((byte *)(ptr + 4) == pbVar6) {
        return -1;
      }
      if ((ptr[5] == '\0') && (ptr[4] == 0x3e)) {
        iVar3 = 0x28;
        pbVar5 = (byte *)(ptr + 6);
        goto switchD_004876e5_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)pbVar6 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_004875e4_caseD_2;
  case 6:
    if ((long)pbVar6 - (long)ptr < 3) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 3);
    break;
  case 7:
    goto switchD_004875e4_caseD_7;
  case 9:
    pbVar1 = (byte *)(ptr + 2);
    if (pbVar1 == pbVar6) {
      return -1;
    }
    iVar3 = 7;
    pbVar5 = pbVar1;
    if ((ptr[3] == '\0') &&
       (pbVar5 = (byte *)(ptr + 4), *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) != '\n'))
    {
      pbVar5 = pbVar1;
    }
    goto switchD_004876e5_caseD_0;
  case 10:
    iVar3 = 7;
    pbVar5 = (byte *)(ptr + 2);
    goto switchD_004876e5_caseD_0;
  }
LAB_00487637:
  iVar3 = 6;
  for (; pbVar5 != pbVar6; pbVar5 = pbVar5 + lVar4) {
    bVar2 = pbVar5[1];
    if (bVar2 - 0xd8 < 4) {
switchD_004876e5_caseD_7:
      lVar4 = 4;
      if ((long)pbVar6 - (long)pbVar5 < 4) break;
    }
    else if (bVar2 == 0) {
      lVar4 = 2;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
      case 0:
      case 1:
      case 4:
      case 8:
      case 9:
      case 10:
        goto switchD_004876e5_caseD_0;
      case 5:
        lVar4 = 2;
        if ((long)pbVar6 - (long)pbVar5 < 2) goto switchD_004876e5_caseD_0;
        break;
      case 6:
        lVar4 = 3;
        if ((long)pbVar6 - (long)pbVar5 < 3) goto switchD_004876e5_caseD_0;
        break;
      case 7:
        goto switchD_004876e5_caseD_7;
      }
    }
    else if (bVar2 == 0xff) {
      lVar4 = 2;
      if (0xfd < *pbVar5) break;
    }
    else {
      lVar4 = 2;
      if (bVar2 - 0xdc < 4) break;
    }
  }
switchD_004876e5_caseD_0:
  *nextTokPtr = (char *)pbVar5;
  return iVar3;
switchD_004875e4_caseD_2:
  pbVar5 = (byte *)(ptr + 2);
  goto LAB_00487637;
}

Assistant:

static
int PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                            const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}